

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O3

void __thiscall Nes_Square::run(Nes_Square *this,cpu_time_t time,cpu_time_t end_time)

{
  uint uVar1;
  byte bVar2;
  Blip_Buffer *pBVar3;
  Blip_Synth<3,_15> *this_00;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong time_00;
  ulong uVar9;
  
  pBVar3 = (this->super_Nes_Envelope).super_Nes_Osc.output;
  if (pBVar3 == (Blip_Buffer *)0x0) {
    return;
  }
  if ((this->super_Nes_Envelope).super_Nes_Osc.length_counter == 0) {
    uVar6 = 0;
  }
  else {
    bVar2 = (this->super_Nes_Envelope).super_Nes_Osc.regs[0];
    if ((bVar2 & 0x10) == 0) {
      uVar6 = (this->super_Nes_Envelope).envelope;
    }
    else {
      uVar6 = bVar2 & 0xf;
    }
  }
  uVar4 = (uint)(this->super_Nes_Envelope).super_Nes_Osc.regs[2] |
          ((this->super_Nes_Envelope).super_Nes_Osc.regs[3] & 7) << 8;
  uVar1 = uVar4 * 2 + 2;
  uVar9 = (ulong)uVar1;
  if ((uVar6 != 0) && (7 < uVar4)) {
    bVar2 = (this->super_Nes_Envelope).super_Nes_Osc.regs[1];
    uVar8 = uVar4 >> (bVar2 & 7);
    if ((bVar2 & 8) != 0) {
      uVar8 = 0;
    }
    if (uVar8 + uVar4 < 0x800) {
      bVar2 = (this->super_Nes_Envelope).super_Nes_Osc.regs[0] >> 6;
      uVar4 = 0;
      if (bVar2 == 3) {
        uVar4 = uVar6;
      }
      uVar8 = 2;
      if (bVar2 != 3) {
        uVar8 = 1 << bVar2;
      }
      iVar5 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
      uVar7 = 0;
      if (this->phase < (int)uVar8) {
        uVar7 = uVar6;
      }
      uVar7 = uVar7 ^ uVar4;
      (this->super_Nes_Envelope).super_Nes_Osc.last_amp = uVar7;
      iVar5 = uVar7 - iVar5;
      if (iVar5 != 0) {
        Blip_Synth<3,_15>::offset(this->synth,time,iVar5,pBVar3);
      }
      time_00 = (this->super_Nes_Envelope).super_Nes_Osc.delay + time;
      if ((long)time_00 < end_time) {
        pBVar3 = (this->super_Nes_Envelope).super_Nes_Osc.output;
        this_00 = this->synth;
        iVar5 = uVar7 * 2 - uVar6;
        uVar4 = this->phase;
        do {
          uVar4 = uVar4 + 1 & 7;
          if ((uVar4 & ~uVar8) == 0) {
            iVar5 = -iVar5;
            Blip_Synth<3,_15>::offset_inline(this_00,time_00,iVar5,pBVar3);
          }
          time_00 = time_00 + uVar1;
        } while ((long)time_00 < end_time);
        (this->super_Nes_Envelope).super_Nes_Osc.last_amp = (int)(iVar5 + uVar6) >> 1;
        this->phase = uVar4;
      }
      goto LAB_001149b0;
    }
  }
  iVar5 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
  if (iVar5 != 0) {
    Blip_Synth<3,_15>::offset(this->synth,time,-iVar5,pBVar3);
    (this->super_Nes_Envelope).super_Nes_Osc.last_amp = 0;
  }
  time_00 = (this->super_Nes_Envelope).super_Nes_Osc.delay + time;
  if ((long)time_00 < end_time) {
    iVar5 = (int)((long)(~time_00 + end_time + uVar9) / (long)uVar9);
    this->phase = iVar5 + this->phase & 7;
    time_00 = time_00 + (long)iVar5 * uVar9;
  }
LAB_001149b0:
  (this->super_Nes_Envelope).super_Nes_Osc.delay = (int)time_00 - (int)end_time;
  return;
}

Assistant:

void Nes_Square::run( cpu_time_t time, cpu_time_t end_time )
{
	if ( !output )
		return;
	
	const int volume = this->volume();
	const int period = this->period();
	int offset = period >> (regs [1] & shift_mask);
	if ( regs [1] & negate_flag )
		offset = 0;
	
	const int timer_period = (period + 1) * 2;
	if ( volume == 0 || period < 8 || (period + offset) >= 0x800 )
	{
		if ( last_amp ) {
			synth->offset( time, -last_amp, output );
			last_amp = 0;
		}
		
		time += delay;
		if ( time < end_time )
		{
			// maintain proper phase
			int count = (end_time - time + timer_period - 1) / timer_period;
			phase = (phase + count) & (phase_range - 1);
			time += (long) count * timer_period;
		}
	}
	else
	{
		// handle duty select
		int duty_select = (regs [0] >> 6) & 3;
		int duty = 1 << duty_select; // 1, 2, 4, 2
		int amp = 0;
		if ( duty_select == 3 ) {
			duty = 2; // negated 25%
			amp = volume;
		}
		if ( phase < duty )
			amp ^= volume;
		
		int delta = update_amp( amp );
		if ( delta )
			synth->offset( time, delta, output );
		
		time += delay;
		if ( time < end_time )
		{
			Blip_Buffer* const output = this->output;
			const Synth* synth = this->synth;
			int delta = amp * 2 - volume;
			int phase = this->phase;
			
			do {
				phase = (phase + 1) & (phase_range - 1);
				if ( phase == 0 || phase == duty ) {
					delta = -delta;
					synth->offset_inline( time, delta, output );
				}
				time += timer_period;
			}
			while ( time < end_time );
			
			last_amp = (delta + volume) >> 1;
			this->phase = phase;
		}
	}
	
	delay = time - end_time;
}